

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Matchers::StdString::RegexMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,RegexMatcher *this)

{
  pointer pcVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::convert(&local_38,&this->m_regex);
  pbVar3 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace(&local_38,0,0,"matches ",8);
  local_58._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar4) {
    local_58.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_58._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  __s = " case insensitively";
  if (this->m_caseSensitivity == Yes) {
    __s = " case sensitively";
  }
  pbVar3 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append(&local_58,__s);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar4) {
    uVar2 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RegexMatcher::describe() const {
            return "matches " + ::Catch::Detail::stringify(m_regex) + ((m_caseSensitivity == CaseSensitive::Choice::Yes)? " case sensitively" : " case insensitively");
        }